

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwMaximizeWindow(GLFWwindow *handle)

{
  unsigned_long *puVar1;
  Window WVar2;
  long lVar3;
  Atom AVar4;
  unsigned_long uVar5;
  ulong uVar6;
  _GLFWwindow *window;
  ulong uVar7;
  int iStack_104;
  uchar *puStack_100;
  unsigned_long uStack_f8;
  unsigned_long uStack_f0;
  XEvent XStack_e8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x40) == 0) {
    if (((_glfw.x11.NET_WM_STATE != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
       (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
      (*_glfw.x11.xlib.GetWindowAttributes)
                (_glfw.x11.display,*(Window *)(handle + 0x348),(XWindowAttributes *)&XStack_e8.xany)
      ;
      AVar4 = _glfw.x11.NET_WM_STATE;
      if (XStack_e8.xcrossing.focus == 2) {
        WVar2 = *(Window *)(handle + 0x348);
        memset(&XStack_e8,0,0xc0);
        XStack_e8.type = 0x21;
        XStack_e8.xexpose.width = 0x20;
        XStack_e8.xproperty.atom = AVar4;
        XStack_e8.xkey.time = 1;
        XStack_e8.xselectionrequest.property = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        XStack_e8.xconfigure.above = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        XStack_e8.pad[10] = 1;
        XStack_e8.xany.window = WVar2;
        (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,&XStack_e8);
      }
      else {
        puStack_100 = (uchar *)0x0;
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,*(Window *)(handle + 0x348),_glfw.x11.NET_WM_STATE,0,
                   0x7fffffffffffffff,0,4,(Atom *)XStack_e8.pad,&iStack_104,&uStack_f0,&uStack_f8,
                   &puStack_100);
        XStack_e8.pad[0] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        XStack_e8.xany.serial = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        uVar7 = 2;
        if (uStack_f0 != 0) {
          uVar5 = 0;
          do {
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              lVar3 = *(long *)(puStack_100 + uVar5 * 8);
              uVar6 = 0;
              do {
                if (lVar3 == *(long *)((long)&XStack_e8 + uVar6 * 8)) {
                  puVar1 = &uStack_f0 + uVar7;
                  uVar7 = uVar7 - 1;
                  *(unsigned_long *)((long)&XStack_e8 + uVar6 * 8) = *puVar1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < uVar7);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uStack_f0);
        }
        if (puStack_100 != (uchar *)0x0) {
          (*_glfw.x11.xlib.Free)(puStack_100);
        }
        if (uVar7 == 0) {
          return;
        }
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(handle + 0x348),_glfw.x11.NET_WM_STATE,4,0x20,2,
                   (uchar *)&XStack_e8.type,(int)uVar7);
      }
      (*_glfw.x11.xlib.Flush)(_glfw.x11.display);
    }
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}